

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O3

void __thiscall
duckdb::SortedAggregateState::UpdateSlice
          (SortedAggregateState *this,AggregateInputData *aggr_input_data,DataChunk *sort_input,
          DataChunk *arg_input)

{
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *this_00;
  idx_t *piVar1;
  SortedAggregateBindData *order_bind;
  pointer pDVar2;
  
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
  order_bind = (SortedAggregateBindData *)(aggr_input_data->bind_data).ptr;
  piVar1 = &this->nsel;
  Resize(this,order_bind,this->nsel + this->count);
  this_00 = &this->sort_chunk;
  if ((this->ordering).
      super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
      .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl ==
      (ColumnDataCollection *)0x0) {
    if ((this_00->super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)._M_t
        .super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
        super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl == (DataChunk *)0x0) {
      LinkedAppend(&order_bind->sort_funcs,aggr_input_data->allocator,sort_input,&this->sort_linked,
                   &this->sel,this->nsel);
      if ((this->arg_linked).super_vector<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>.
          super__Vector_base<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->arg_linked).super_vector<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>.
          super__Vector_base<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        LinkedAppend(&order_bind->arg_funcs,aggr_input_data->allocator,arg_input,&this->arg_linked,
                     &this->sel,*piVar1);
      }
    }
    else {
      pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->(this_00);
      DataChunk::Append(pDVar2,sort_input,true,&this->sel,this->nsel);
      if ((this->arg_chunk).
          super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
          super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
          super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl != (DataChunk *)0x0) {
        pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->(&this->arg_chunk);
        DataChunk::Append(pDVar2,arg_input,true,&this->sel,*piVar1);
      }
    }
  }
  else {
    pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       (this_00);
    DataChunk::Slice(pDVar2,sort_input,&this->sel,this->nsel,0);
    if ((this->arg_chunk).
        super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
        super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
        super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl != (DataChunk *)0x0) {
      pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->(&this->arg_chunk);
      DataChunk::Slice(pDVar2,arg_input,&this->sel,*piVar1,0);
    }
    FlushChunks(this,order_bind);
  }
  *piVar1 = 0;
  this->offset = 0;
  return;
}

Assistant:

void UpdateSlice(const AggregateInputData &aggr_input_data, DataChunk &sort_input, DataChunk &arg_input) {
		const auto &order_bind = aggr_input_data.bind_data->Cast<SortedAggregateBindData>();
		Resize(order_bind, count + nsel);

		if (ordering) {
			//	Using collections
			D_ASSERT(sort_chunk);
			sort_chunk->Slice(sort_input, sel, nsel);
			if (arg_chunk) {
				arg_chunk->Slice(arg_input, sel, nsel);
			}
			FlushChunks(order_bind);
		} else if (sort_chunk) {
			//	Still using data chunks
			sort_chunk->Append(sort_input, true, &sel, nsel);
			if (arg_chunk) {
				arg_chunk->Append(arg_input, true, &sel, nsel);
			}
		} else {
			//	Still using linked lists
			LinkedAppend(order_bind.sort_funcs, aggr_input_data.allocator, sort_input, sort_linked, sel, nsel);
			if (!arg_linked.empty()) {
				LinkedAppend(order_bind.arg_funcs, aggr_input_data.allocator, arg_input, arg_linked, sel, nsel);
			}
		}

		nsel = 0;
		offset = 0;
	}